

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlNodeGetBaseSafe(xmlDoc *doc,xmlNode *cur,xmlChar **baseOut)

{
  xmlNode *node;
  char cVar1;
  int iVar2;
  xmlChar *pxVar3;
  long lVar4;
  xmlEntityPtr ent;
  xmlChar *newbase;
  xmlChar *base;
  xmlChar *local_58;
  xmlChar *local_50;
  xmlChar *local_48;
  _xmlDoc *local_40;
  xmlChar **local_38;
  
  local_58 = (xmlChar *)0x0;
  if (baseOut == (xmlChar **)0x0) {
    return 1;
  }
  *baseOut = (xmlChar *)0x0;
  if (doc == (xmlDoc *)0x0 && cur == (xmlNode *)0x0) {
    return 1;
  }
  if ((cur != (xmlNode *)0x0) && (cur->type == XML_NAMESPACE_DECL)) {
    return 1;
  }
  if (doc == (xmlDoc *)0x0) {
    doc = cur->doc;
  }
  local_38 = baseOut;
  if ((doc == (_xmlDoc *)0x0) || (doc->type != XML_HTML_DOCUMENT_NODE)) {
    if (cur != (xmlNode *)0x0) {
      local_40 = doc;
      do {
        if (cur->type == XML_ELEMENT_NODE) {
          iVar2 = xmlNodeGetAttrValue(cur,"base",(xmlChar *)"http://www.w3.org/XML/1998/namespace",
                                      &local_48);
          if (iVar2 < 0) {
            (*xmlFree)(local_58);
            return -1;
          }
          if (local_48 != (xmlChar *)0x0) {
            pxVar3 = local_48;
            if (local_58 != (xmlChar *)0x0) {
              iVar2 = xmlBuildURISafe(local_58,local_48,&local_50);
              (*xmlFree)(local_58);
              (*xmlFree)(local_48);
              pxVar3 = local_50;
              doc = local_40;
              if (iVar2 != 0) {
                return iVar2;
              }
            }
            local_58 = pxVar3;
            iVar2 = xmlStrncmp(pxVar3,(xmlChar *)"http://",7);
            if (((iVar2 == 0) || (iVar2 = xmlStrncmp(local_58,(xmlChar *)"ftp://",6), iVar2 == 0))
               || (iVar2 = xmlStrncmp(local_58,(xmlChar *)"urn:",4), iVar2 == 0)) goto LAB_00150353;
          }
        }
        else if (cur->type == XML_ENTITY_DECL) {
          if (cur[1]._private == (void *)0x0) {
            cVar1 = '\x06';
          }
          else {
            (*xmlFree)(local_58);
            local_58 = xmlStrdup((xmlChar *)cur[1]._private);
            cVar1 = (local_58 != (xmlChar *)0x0) * '\x03' + '\x01';
          }
          if (cVar1 == '\x04') goto LAB_00150353;
          if (cVar1 != '\x06') {
            return -1;
          }
          break;
        }
        cur = cur->parent;
      } while (cur != (_xmlNode *)0x0);
    }
    if ((doc != (_xmlDoc *)0x0) && (pxVar3 = doc->URL, pxVar3 != (xmlChar *)0x0)) {
      if (local_58 == (xmlChar *)0x0) {
        local_58 = xmlStrdup(pxVar3);
        if (local_58 == (xmlChar *)0x0) {
          return -1;
        }
      }
      else {
        iVar2 = xmlBuildURISafe(local_58,pxVar3,&local_50);
        (*xmlFree)(local_58);
        if (iVar2 != 0) {
          return iVar2;
        }
        local_58 = local_50;
      }
    }
LAB_00150353:
    *local_38 = local_58;
  }
  else {
    for (node = doc->children; (node != (xmlNode *)0x0 && (node->name != (xmlChar *)0x0));
        node = *(xmlNode **)((long)&node->_private + lVar4)) {
      lVar4 = 0x30;
      if (node->type == XML_ELEMENT_NODE) {
        iVar2 = xmlStrcasecmp(node->name,"html");
        lVar4 = 0x18;
        if ((iVar2 != 0) && (iVar2 = xmlStrcasecmp(node->name,"head"), iVar2 != 0)) {
          iVar2 = xmlStrcasecmp(node->name,"base");
          lVar4 = 0x30;
          if (iVar2 == 0) {
            iVar2 = xmlNodeGetAttrValue(node,"href",(xmlChar *)0x0,&local_58);
            if (iVar2 < 0) {
              return -1;
            }
            if (local_58 == (xmlChar *)0x0) {
              return 1;
            }
            goto LAB_00150353;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int
xmlNodeGetBaseSafe(const xmlDoc *doc, const xmlNode *cur, xmlChar **baseOut) {
    xmlChar *ret = NULL;
    xmlChar *base, *newbase;
    int res;

    if (baseOut == NULL)
        return(1);
    *baseOut = NULL;
    if ((cur == NULL) && (doc == NULL))
        return(1);
    if ((cur != NULL) && (cur->type == XML_NAMESPACE_DECL))
        return(1);
    if (doc == NULL)
        doc = cur->doc;

    if ((doc != NULL) && (doc->type == XML_HTML_DOCUMENT_NODE)) {
        cur = doc->children;
	while ((cur != NULL) && (cur->name != NULL)) {
	    if (cur->type != XML_ELEMENT_NODE) {
	        cur = cur->next;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "html")) {
	        cur = cur->children;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "head")) {
	        cur = cur->children;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "base")) {
                if (xmlNodeGetAttrValue(cur, BAD_CAST "href", NULL, &ret) < 0)
                    return(-1);
                if (ret == NULL)
                    return(1);
                goto found;
	    }
	    cur = cur->next;
	}
	return(0);
    }

    while (cur != NULL) {
	if (cur->type == XML_ENTITY_DECL) {
	    xmlEntityPtr ent = (xmlEntityPtr) cur;

            if (ent->URI == NULL)
                break;
            xmlFree(ret);
	    ret = xmlStrdup(ent->URI);
            if (ret == NULL)
                return(-1);
            goto found;
	}
	if (cur->type == XML_ELEMENT_NODE) {
	    if (xmlNodeGetAttrValue(cur, BAD_CAST "base", XML_XML_NAMESPACE,
                                    &base) < 0) {
                xmlFree(ret);
                return(-1);
            }
	    if (base != NULL) {
		if (ret != NULL) {
		    res = xmlBuildURISafe(ret, base, &newbase);
                    xmlFree(ret);
                    xmlFree(base);
                    if (res != 0)
                        return(res);
		    ret = newbase;
		} else {
		    ret = base;
		}
		if ((!xmlStrncmp(ret, BAD_CAST "http://", 7)) ||
		    (!xmlStrncmp(ret, BAD_CAST "ftp://", 6)) ||
		    (!xmlStrncmp(ret, BAD_CAST "urn:", 4)))
                    goto found;
	    }
	}
	cur = cur->parent;
    }

    if ((doc != NULL) && (doc->URL != NULL)) {
	if (ret == NULL) {
	    ret = xmlStrdup(doc->URL);
            if (ret == NULL)
                return(-1);
        } else {
            res = xmlBuildURISafe(ret, doc->URL, &newbase);
            xmlFree(ret);
            if (res != 0)
                return(res);
            ret = newbase;
        }
    }

found:
    *baseOut = ret;
    return(0);
}